

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::CopyFileAlways(string *source,string *destination)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  char *pcVar5;
  long lVar6;
  long local_14f8;
  ofstream fout;
  long local_12f0;
  ifstream fin;
  string local_10e8;
  string local_10c8;
  undefined1 local_10a8 [8];
  string source_name;
  undefined1 local_1078 [8];
  string destination_dir;
  string real_destination;
  char buffer [4096];
  int bufferSize;
  bool perms;
  string *psStack_20;
  mode_t perm;
  string *destination_local;
  string *source_local;
  
  psStack_20 = destination;
  destination_local = source;
  bVar1 = SameFile(source,destination);
  if (bVar1) {
    source_local._7_1_ = 1;
  }
  else {
    bufferSize = 0;
    bVar1 = GetPermissions(destination_local,(mode_t *)&bufferSize);
    std::__cxx11::string::string
              ((string *)(destination_dir.field_2._M_local_buf + 8),(string *)psStack_20);
    std::__cxx11::string::string((string *)local_1078);
    bVar2 = FileExists(psStack_20);
    if ((bVar2) && (bVar2 = FileIsDirectory(psStack_20), bVar2)) {
      std::__cxx11::string::operator=
                ((string *)local_1078,(string *)(destination_dir.field_2._M_local_buf + 8));
      ConvertToUnixSlashes((string *)((long)&destination_dir.field_2 + 8));
      std::__cxx11::string::operator+=((string *)(destination_dir.field_2._M_local_buf + 8),'/');
      std::__cxx11::string::string((string *)local_10a8,(string *)destination_local);
      GetFilenameName(&local_10c8,(string *)local_10a8);
      std::__cxx11::string::operator+=
                ((string *)(destination_dir.field_2._M_local_buf + 8),(string *)&local_10c8);
      std::__cxx11::string::~string((string *)&local_10c8);
      std::__cxx11::string::~string((string *)local_10a8);
    }
    else {
      GetFilenamePath(&local_10e8,psStack_20);
      std::__cxx11::string::operator=((string *)local_1078,(string *)&local_10e8);
      std::__cxx11::string::~string((string *)&local_10e8);
    }
    MakeDirectory((string *)local_1078);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    _Var4 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(&local_12f0,pcVar5,_Var4);
    bVar3 = std::ios::operator!((ios *)((long)&local_12f0 + *(long *)(local_12f0 + -0x18)));
    if ((bVar3 & 1) == 0) {
      RemoveFile((string *)((long)&destination_dir.field_2 + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      _Var4 = std::operator|(_S_out,_S_trunc);
      _Var4 = std::operator|(_Var4,_S_bin);
      std::ofstream::ofstream(&local_14f8,pcVar5,_Var4);
      bVar3 = std::ios::operator!((ios *)((long)&local_14f8 + *(long *)(local_14f8 + -0x18)));
      if ((bVar3 & 1) == 0) {
        while (bVar2 = std::ios::operator_cast_to_bool
                                 ((ios *)((long)&local_12f0 + *(long *)(local_12f0 + -0x18))), bVar2
              ) {
          std::istream::read((char *)&local_12f0,(long)((long)&real_destination.field_2 + 8));
          lVar6 = std::istream::gcount();
          if (lVar6 == 0) break;
          std::istream::gcount();
          std::ostream::write((char *)&local_14f8,(long)((long)&real_destination.field_2 + 8));
        }
        std::ostream::flush();
        std::ifstream::close();
        std::ofstream::close();
        bVar3 = std::ios::operator!((ios *)((long)&local_14f8 + *(long *)(local_14f8 + -0x18)));
        if ((bVar3 & 1) == 0) {
          if ((!bVar1) ||
             (bVar1 = SetPermissions((string *)((long)&destination_dir.field_2 + 8),bufferSize),
             bVar1)) {
            source_local._7_1_ = 1;
          }
          else {
            source_local._7_1_ = 0;
          }
        }
        else {
          source_local._7_1_ = 0;
        }
      }
      else {
        source_local._7_1_ = 0;
      }
      fout._508_4_ = 1;
      std::ofstream::~ofstream(&local_14f8);
    }
    else {
      source_local._7_1_ = 0;
      fout._508_4_ = 1;
    }
    std::ifstream::~ifstream(&local_12f0);
    std::__cxx11::string::~string((string *)local_1078);
    std::__cxx11::string::~string((string *)(destination_dir.field_2._M_local_buf + 8));
  }
  return (bool)(source_local._7_1_ & 1);
}

Assistant:

bool SystemTools::CopyFileAlways(const kwsys_stl::string& source, const kwsys_stl::string& destination)
{
  // If files are the same do not copy
  if ( SystemTools::SameFile(source, destination) )
    {
    return true;
    }
  mode_t perm = 0;
  bool perms = SystemTools::GetPermissions(source, perm);

  const int bufferSize = 4096;
  char buffer[bufferSize];

  // If destination is a directory, try to create a file with the same
  // name as the source in that directory.

  kwsys_stl::string real_destination = destination;
  kwsys_stl::string destination_dir;
  if(SystemTools::FileExists(destination) &&
     SystemTools::FileIsDirectory(destination))
    {
    destination_dir = real_destination;
    SystemTools::ConvertToUnixSlashes(real_destination);
    real_destination += '/';
    kwsys_stl::string source_name = source;
    real_destination += SystemTools::GetFilenameName(source_name);
    }
  else
    {
    destination_dir = SystemTools::GetFilenamePath(destination);
    }

  // Create destination directory

  SystemTools::MakeDirectory(destination_dir);

  // Open files
#if defined(_WIN32)
  kwsys::ifstream fin(Encoding::ToNarrow(
    SystemTools::ConvertToWindowsExtendedPath(source)).c_str(),
                kwsys_ios::ios::in | kwsys_ios_binary);
#else
  kwsys::ifstream fin(source.c_str(),
                kwsys_ios::ios::in | kwsys_ios_binary);
#endif
  if(!fin)
    {
    return false;
    }

  // try and remove the destination file so that read only destination files
  // can be written to.
  // If the remove fails continue so that files in read only directories
  // that do not allow file removal can be modified.
  SystemTools::RemoveFile(real_destination);

#if defined(_WIN32)
  kwsys::ofstream fout(Encoding::ToNarrow(
    SystemTools::ConvertToWindowsExtendedPath(real_destination)).c_str(),
                     kwsys_ios::ios::out | kwsys_ios::ios::trunc | kwsys_ios_binary);
#else
  kwsys::ofstream fout(real_destination.c_str(),
                     kwsys_ios::ios::out | kwsys_ios::ios::trunc | kwsys_ios_binary);
#endif
  if(!fout)
    {
    return false;
    }

  // This copy loop is very sensitive on certain platforms with
  // slightly broken stream libraries (like HPUX).  Normally, it is
  // incorrect to not check the error condition on the fin.read()
  // before using the data, but the fin.gcount() will be zero if an
  // error occurred.  Therefore, the loop should be safe everywhere.
  while(fin)
    {
    fin.read(buffer, bufferSize);
    if(fin.gcount())
      {
      fout.write(buffer, fin.gcount());
      }
    else
      {
      break;
      }
    }

  // Make sure the operating system has finished writing the file
  // before closing it.  This will ensure the file is finished before
  // the check below.
  fout.flush();

  fin.close();
  fout.close();

  if(!fout)
    {
    return false;
    }
  if ( perms )
    {
    if ( !SystemTools::SetPermissions(real_destination, perm) )
      {
      return false;
      }
    }
  return true;
}